

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex2.cpp
# Opt level: O2

char * strdup(char *__s)

{
  void *pvVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  if (__s == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    for (lVar4 = 0; __s[lVar4] != '\0'; lVar4 = lVar4 + 1) {
    }
    pvVar1 = operator_new__(lVar4 + 1);
    for (lVar3 = 0; __s[lVar3] != '\0'; lVar3 = lVar3 + 1) {
      *(char *)((long)pvVar1 + lVar3) = __s[lVar3];
    }
    *(undefined1 *)((long)pvVar1 + lVar3) = 0;
    pcVar2 = (char *)((long)pvVar1 + (lVar3 - lVar4));
  }
  return pcVar2;
}

Assistant:

char *strdup(const char *str) {
  // check for nullptr
  if (!str) {
    return nullptr;
  }
  // get size of C string
  size_t size = 0;
  while (*str) {
    size++;
    str++;
  }
  // + 1 here to add space for \0 character
  char *s = new char[size + 1];
  // move pointer to the start of the string
  str -= size;
  while (*str) {
    *s++ = *str++;
  }
  // add terminating character
  *s = '\0';
  // move pointer to the start of the string
  s -= size;
  return s;
}